

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_prepro.cpp
# Opt level: O0

DFsSection * __thiscall DFsScript::FindSectionStart(DFsScript *this,char *brace)

{
  int iVar1;
  char *pcVar2;
  DFsSection *local_30;
  DFsSection *current;
  int n;
  char *brace_local;
  DFsScript *this_local;
  
  iVar1 = section_hash(this,brace);
  local_30 = ::TObjPtr::operator_cast_to_DFsSection_((TObjPtr *)(this->sections + iVar1));
  while( true ) {
    if (local_30 == (DFsSection *)0x0) {
      return (DFsSection *)0x0;
    }
    pcVar2 = SectionStart(this,local_30);
    if (pcVar2 == brace) break;
    local_30 = ::TObjPtr::operator_cast_to_DFsSection_((TObjPtr *)&local_30->next);
  }
  return local_30;
}

Assistant:

DFsSection *DFsScript::FindSectionStart(const char *brace)
{
	int n = section_hash(brace);
	DFsSection *current = sections[n];
	
	// use the hash table: check the appropriate hash chain
	
	while(current)
    {
		if(SectionStart(current) == brace) return current;
		current = current->next;
    }
	
	return NULL;    // not found
}